

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O0

void Abc_SclReadSurface(Vec_Str_t *vOut,int *pPos,SC_Surface *p)

{
  int iVar1;
  Vec_Flt_t *p_00;
  Vec_Int_t *p_01;
  float fVar2;
  float Num_2;
  float Num_1;
  float Num;
  int j;
  int i;
  Vec_Int_t *vVecI;
  Vec_Flt_t *vVec;
  SC_Surface *p_local;
  int *pPos_local;
  Vec_Str_t *vOut_local;
  
  for (Num = (float)Vec_StrGetI(vOut,pPos); Num != 0.0; Num = (float)((int)Num + -1)) {
    fVar2 = Vec_StrGetF(vOut,pPos);
    Vec_FltPush(&p->vIndex0,fVar2);
    iVar1 = Scl_Flt2Int(fVar2);
    Vec_IntPush(&p->vIndex0I,iVar1);
  }
  for (Num = (float)Vec_StrGetI(vOut,pPos); Num != 0.0; Num = (float)((int)Num + -1)) {
    fVar2 = Vec_StrGetF(vOut,pPos);
    Vec_FltPush(&p->vIndex1,fVar2);
    iVar1 = Scl_Flt2Int(fVar2);
    Vec_IntPush(&p->vIndex1I,iVar1);
  }
  Num = 0.0;
  while( true ) {
    iVar1 = Vec_FltSize(&p->vIndex0);
    if (iVar1 <= (int)Num) break;
    iVar1 = Vec_FltSize(&p->vIndex1);
    p_00 = Vec_FltAlloc(iVar1);
    Vec_PtrPush(&p->vData,p_00);
    iVar1 = Vec_FltSize(&p->vIndex1);
    p_01 = Vec_IntAlloc(iVar1);
    Vec_PtrPush(&p->vDataI,p_01);
    Num_1 = 0.0;
    while( true ) {
      iVar1 = Vec_FltSize(&p->vIndex1);
      if (iVar1 <= (int)Num_1) break;
      fVar2 = Vec_StrGetF(vOut,pPos);
      Vec_FltPush(p_00,fVar2);
      iVar1 = Scl_Flt2Int(fVar2);
      Vec_IntPush(p_01,iVar1);
      Num_1 = (float)((int)Num_1 + 1);
    }
    Num = (float)((int)Num + 1);
  }
  for (Num = 0.0; (int)Num < 3; Num = (float)((int)Num + 1)) {
    fVar2 = Vec_StrGetF(vOut,pPos);
    p->approx[0][(int)Num] = fVar2;
  }
  for (Num = 0.0; (int)Num < 4; Num = (float)((int)Num + 1)) {
    fVar2 = Vec_StrGetF(vOut,pPos);
    p->approx[1][(int)Num] = fVar2;
  }
  for (Num = 0.0; (int)Num < 6; Num = (float)((int)Num + 1)) {
    fVar2 = Vec_StrGetF(vOut,pPos);
    p->approx[2][(int)Num] = fVar2;
  }
  return;
}

Assistant:

static void Abc_SclReadSurface( Vec_Str_t * vOut, int * pPos, SC_Surface * p )
{
    Vec_Flt_t * vVec;
    Vec_Int_t * vVecI;
    int i, j;

    for ( i = Vec_StrGetI(vOut, pPos); i != 0; i-- )
    {
        float Num = Vec_StrGetF(vOut, pPos);
        Vec_FltPush( &p->vIndex0, Num );
        Vec_IntPush( &p->vIndex0I, Scl_Flt2Int(Num) );
    }

    for ( i = Vec_StrGetI(vOut, pPos); i != 0; i-- )
    {
        float Num = Vec_StrGetF(vOut, pPos);
        Vec_FltPush( &p->vIndex1, Num );
        Vec_IntPush( &p->vIndex1I, Scl_Flt2Int(Num) );
    }

    for ( i = 0; i < Vec_FltSize(&p->vIndex0); i++ )
    {
        vVec = Vec_FltAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vData, vVec );
        vVecI = Vec_IntAlloc( Vec_FltSize(&p->vIndex1) );
        Vec_PtrPush( &p->vDataI, vVecI );
        for ( j = 0; j < Vec_FltSize(&p->vIndex1); j++ )
        {
            float Num = Vec_StrGetF(vOut, pPos);
            Vec_FltPush( vVec, Num );
            Vec_IntPush( vVecI, Scl_Flt2Int(Num) );
        }
    }

    for ( i = 0; i < 3; i++ ) 
        p->approx[0][i] = Vec_StrGetF( vOut, pPos );
    for ( i = 0; i < 4; i++ ) 
        p->approx[1][i] = Vec_StrGetF( vOut, pPos );
    for ( i = 0; i < 6; i++ ) 
        p->approx[2][i] = Vec_StrGetF( vOut, pPos );
}